

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_curve.cpp
# Opt level: O1

bool __thiscall ON_CurveArray::Write(ON_CurveArray *this,ON_BinaryArchive *file)

{
  bool bVar1;
  bool bVar2;
  long lVar3;
  
  bVar1 = ON_BinaryArchive::BeginWrite3dmChunk(file,0x40008000,0);
  if (bVar1) {
    bVar1 = ON_BinaryArchive::Write3dmChunkVersion(file,1,0);
  }
  if (bVar1 != false) {
    bVar2 = ON_BinaryArchive::WriteInt(file,(this->super_ON_SimpleArray<ON_Curve_*>).m_count);
    if ((bVar2) && (0 < (this->super_ON_SimpleArray<ON_Curve_*>).m_count)) {
      lVar3 = 1;
      do {
        if ((this->super_ON_SimpleArray<ON_Curve_*>).m_a[lVar3 + -1] == (ON_Curve *)0x0) {
          bVar2 = ON_BinaryArchive::WriteInt(file,0);
        }
        else {
          bVar2 = ON_BinaryArchive::WriteInt(file,1);
          if (bVar2) {
            bVar2 = ON_BinaryArchive::WriteObject
                              (file,(ON_Object *)
                                    (this->super_ON_SimpleArray<ON_Curve_*>).m_a[lVar3 + -1]);
          }
        }
      } while ((bVar2 != false) &&
              (bVar1 = lVar3 < (this->super_ON_SimpleArray<ON_Curve_*>).m_count, lVar3 = lVar3 + 1,
              bVar1));
    }
    bVar1 = ON_BinaryArchive::EndWrite3dmChunk(file);
    bVar1 = (bool)(bVar1 & bVar2);
  }
  return bVar1;
}

Assistant:

bool ON_CurveArray::Write( ON_BinaryArchive& file ) const
{
  bool rc = file.BeginWrite3dmChunk( TCODE_ANONYMOUS_CHUNK, 0 );
  if (rc) rc = file.Write3dmChunkVersion(1,0);
  if (rc ) {
    int i;
    rc = file.WriteInt( Count() );
    for ( i = 0; rc && i < Count(); i++ ) {
      if ( m_a[i] ) {
        rc = file.WriteInt(1);
        if ( rc ) 
          rc = file.WriteObject( *m_a[i] ); // polymorphic curves
      }
      else {
        // nullptr curve
        rc = file.WriteInt(0);
      }
    }
    if ( !file.EndWrite3dmChunk() )
      rc = false;
  }
  return rc;
}